

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

int Gia_Iso2ManCheckIsoPair
              (Gia_Man_t *p,Vec_Int_t *vVec0,Vec_Int_t *vVec1,Vec_Int_t *vMap0,Vec_Int_t *vMap1)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  
  if (0 < (long)vVec0->nSize) {
    uVar6 = 0;
    uVar5 = (ulong)(uint)vVec1->nSize;
    if (vVec1->nSize < 1) {
      uVar5 = uVar6;
    }
    do {
      if (uVar5 == uVar6) goto LAB_00757300;
      uVar11 = vVec0->pArray[uVar6];
      uVar12 = vVec1->pArray[uVar6];
      if (uVar11 != uVar12) {
        if (((((int)uVar11 < 0) || (p->nObjs <= (int)uVar11)) || ((int)uVar12 < 0)) ||
           ((uint)p->nObjs <= uVar12)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar2 = p->pObjs;
        pGVar1 = pGVar2 + uVar11;
        if (pGVar1->Value != pGVar2[uVar12].Value) {
          return 0;
        }
        uVar3 = *(ulong *)pGVar1;
        uVar8 = (uint)uVar3;
        if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
          pGVar2 = pGVar2 + uVar12;
          uVar4 = *(ulong *)pGVar2;
          uVar7 = (uint)(uVar3 >> 0x20);
          uVar9 = (uint)(uVar4 >> 0x20);
          uVar10 = (uint)uVar4;
          if (pGVar1[-(uVar3 >> 0x20 & 0x1fffffff)].Value < pGVar1[-(uVar3 & 0x1fffffff)].Value) {
            if (pGVar2[-(uVar4 >> 0x20 & 0x1fffffff)].Value < pGVar2[-(uVar4 & 0x1fffffff)].Value) {
              if (((uVar4 ^ uVar3) & 0x2000000000000000) != 0) {
                return 0;
              }
              if (((uVar10 ^ uVar8) >> 0x1d & 1) != 0) {
                return 0;
              }
              uVar7 = uVar11 - (uVar7 & 0x1fffffff);
              if ((((int)uVar7 < 0) || (vMap0->nSize <= (int)uVar7)) ||
                 ((uVar9 = uVar12 - (uVar9 & 0x1fffffff), (int)uVar9 < 0 ||
                  (vMap1->nSize <= (int)uVar9)))) {
LAB_00757300:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if (vMap0->pArray[uVar7] != vMap1->pArray[uVar9]) {
                return 0;
              }
              uVar11 = uVar11 - (uVar8 & 0x1fffffff);
              if ((((int)uVar11 < 0) || ((uint)vMap0->nSize <= uVar11)) ||
                 ((uVar12 = uVar12 - (uVar10 & 0x1fffffff), (int)uVar12 < 0 ||
                  ((uint)vMap1->nSize <= uVar12)))) goto LAB_00757300;
              bVar13 = vMap0->pArray[uVar11] == vMap1->pArray[uVar12];
            }
            else {
              if ((((uint)(uVar4 >> 0x1d) & 7 ^ uVar7 >> 0x1d) & 1) != 0) {
                return 0;
              }
              if (((uVar9 >> 0x1d ^ (uint)(uVar3 >> 0x1d) & 7) & 1) != 0) {
                return 0;
              }
              uVar7 = uVar11 - (uVar7 & 0x1fffffff);
              if ((((int)uVar7 < 0) || (vMap0->nSize <= (int)uVar7)) ||
                 ((uVar10 = uVar12 - (uVar10 & 0x1fffffff), (int)uVar10 < 0 ||
                  (vMap1->nSize <= (int)uVar10)))) goto LAB_00757300;
              if (vMap0->pArray[uVar7] != vMap1->pArray[uVar10]) {
                return 0;
              }
              uVar11 = uVar11 - (uVar8 & 0x1fffffff);
              if (((((int)uVar11 < 0) || ((uint)vMap0->nSize <= uVar11)) ||
                  (uVar12 = uVar12 - (uVar9 & 0x1fffffff), (int)uVar12 < 0)) ||
                 ((uint)vMap1->nSize <= uVar12)) goto LAB_00757300;
              bVar13 = vMap0->pArray[uVar11] == vMap1->pArray[uVar12];
            }
          }
          else if (pGVar2[-(uVar4 >> 0x20 & 0x1fffffff)].Value < pGVar2[-(uVar4 & 0x1fffffff)].Value
                  ) {
            if (((uVar9 >> 0x1d ^ (uint)(uVar3 >> 0x1d) & 7) & 1) != 0) {
              return 0;
            }
            if ((((uint)(uVar4 >> 0x1d) & 7 ^ uVar7 >> 0x1d) & 1) != 0) {
              return 0;
            }
            uVar8 = uVar11 - (uVar8 & 0x1fffffff);
            if (((((int)uVar8 < 0) || (vMap0->nSize <= (int)uVar8)) ||
                (uVar9 = uVar12 - (uVar9 & 0x1fffffff), (int)uVar9 < 0)) ||
               (vMap1->nSize <= (int)uVar9)) goto LAB_00757300;
            if (vMap0->pArray[uVar8] != vMap1->pArray[uVar9]) {
              return 0;
            }
            uVar11 = uVar11 - (uVar7 & 0x1fffffff);
            if ((((int)uVar11 < 0) || ((uint)vMap0->nSize <= uVar11)) ||
               ((uVar12 = uVar12 - (uVar10 & 0x1fffffff), (int)uVar12 < 0 ||
                ((uint)vMap1->nSize <= uVar12)))) goto LAB_00757300;
            bVar13 = vMap0->pArray[uVar11] == vMap1->pArray[uVar12];
          }
          else {
            if (((uVar10 ^ uVar8) >> 0x1d & 1) != 0) {
              return 0;
            }
            if (((uVar4 ^ uVar3) & 0x2000000000000000) != 0) {
              return 0;
            }
            uVar8 = uVar11 - (uVar8 & 0x1fffffff);
            if ((((int)uVar8 < 0) || (vMap0->nSize <= (int)uVar8)) ||
               ((uVar10 = uVar12 - (uVar10 & 0x1fffffff), (int)uVar10 < 0 ||
                (vMap1->nSize <= (int)uVar10)))) goto LAB_00757300;
            if (vMap0->pArray[uVar8] != vMap1->pArray[uVar10]) {
              return 0;
            }
            uVar11 = uVar11 - (uVar7 & 0x1fffffff);
            if ((((int)uVar11 < 0) || ((uint)vMap0->nSize <= uVar11)) ||
               ((uVar12 = uVar12 - (uVar9 & 0x1fffffff), (int)uVar12 < 0 ||
                ((uint)vMap1->nSize <= uVar12)))) goto LAB_00757300;
            bVar13 = vMap0->pArray[uVar11] == vMap1->pArray[uVar12];
          }
          if (!bVar13) {
            return 0;
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while ((long)vVec0->nSize != uVar6);
  }
  return 1;
}

Assistant:

int Gia_Iso2ManCheckIsoPair( Gia_Man_t * p, Vec_Int_t * vVec0, Vec_Int_t * vVec1, Vec_Int_t * vMap0, Vec_Int_t * vMap1 )
{
    Gia_Obj_t * pObj0, * pObj1;
    int k, iObj0, iObj1;
    Vec_IntForEachEntryTwo( vVec0, vVec1, iObj0, iObj1, k )
    {
        if ( iObj0 == iObj1 )
            continue;
        pObj0 = Gia_ManObj(p, iObj0);
        pObj1 = Gia_ManObj(p, iObj1);
        if ( pObj0->Value != pObj1->Value )
            return 0;
        assert( pObj0->Value == pObj1->Value );
        if ( !Gia_ObjIsAnd(pObj0) )
            continue;
        if ( Gia_ObjFanin0(pObj0)->Value <= Gia_ObjFanin1(pObj0)->Value )
        {
            if ( Gia_ObjFanin0(pObj1)->Value <= Gia_ObjFanin1(pObj1)->Value )
            {
                if ( Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC0(pObj1)  || Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC1(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) )
                     return 0;
            }
            else
            {
                if ( Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC1(pObj1)  || Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC0(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) )
                     return 0;
            }
        }
        else
        {
            if ( Gia_ObjFanin0(pObj1)->Value <= Gia_ObjFanin1(pObj1)->Value )
            {
                if ( Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC0(pObj1)  || Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC1(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) )
                     return 0;
            }
            else
            {
                if ( Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC1(pObj1)  || Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC0(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) )
                     return 0;
            }
        }
    }
    return 1;
}